

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void FCanvasTextureInfo::Serialize(FSerializer *arc)

{
  bool bVar1;
  AActor *pAVar2;
  FSerializer *pFVar3;
  FCanvasTextureInfo **ppFVar4;
  FTextureID picnum;
  int fov;
  AActor *viewpoint;
  FTextureID local_40;
  int local_3c;
  AActor *local_38;
  
  if (arc->w == (FWriter *)0x0) {
    bVar1 = FSerializer::BeginArray(arc,"canvastextures");
    if (bVar1) {
      while( true ) {
        bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
        if (!bVar1) break;
        pFVar3 = FSerializer::operator()(arc,"viewpoint",&local_38);
        pFVar3 = FSerializer::operator()(pFVar3,"fov",&local_3c);
        pFVar3 = FSerializer::operator()(pFVar3,"texture",&local_40);
        FSerializer::EndObject(pFVar3);
        Add(local_38,local_40,local_3c);
      }
      FSerializer::EndArray(arc);
    }
  }
  else if (List != (FCanvasTextureInfo *)0x0) {
    bVar1 = FSerializer::BeginArray(arc,"canvastextures");
    if (bVar1) {
      ppFVar4 = &List;
      while (ppFVar4 = &((FCanvasTextureInfo *)ppFVar4)->Next->Next,
            (FCanvasTextureInfo *)ppFVar4 != (FCanvasTextureInfo *)0x0) {
        if (((FCanvasTextureInfo *)ppFVar4)->Texture != (FCanvasTexture *)0x0) {
          pAVar2 = GC::ReadBarrier<AActor>((AActor **)&((FCanvasTextureInfo *)ppFVar4)->Viewpoint);
          if (pAVar2 != (AActor *)0x0) {
            bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
            if (bVar1) {
              pFVar3 = FSerializer::operator()
                                 (arc,"viewpoint",&((FCanvasTextureInfo *)ppFVar4)->Viewpoint);
              pFVar3 = FSerializer::operator()(pFVar3,"fov",&((FCanvasTextureInfo *)ppFVar4)->FOV);
              pFVar3 = FSerializer::operator()
                                 (pFVar3,"texture",&((FCanvasTextureInfo *)ppFVar4)->PicNum);
              FSerializer::EndObject(pFVar3);
            }
          }
        }
      }
      FSerializer::EndArray(arc);
      return;
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::Serialize(FSerializer &arc)
{
	if (arc.isWriting())
	{
		if (List != nullptr)
		{
			if (arc.BeginArray("canvastextures"))
			{
				FCanvasTextureInfo *probe;

				for (probe = List; probe != nullptr; probe = probe->Next)
				{
					if (probe->Texture != nullptr && probe->Viewpoint != nullptr)
					{
						if (arc.BeginObject(nullptr))
						{
							arc("viewpoint", probe->Viewpoint)
								("fov", probe->FOV)
								("texture", probe->PicNum)
								.EndObject();
						}
					}
				}
				arc.EndArray();
			}
		}
	}
	else
	{
		if (arc.BeginArray("canvastextures"))
		{
			AActor *viewpoint;
			int fov;
			FTextureID picnum;
			while (arc.BeginObject(nullptr))
			{
				arc("viewpoint", viewpoint)
					("fov", fov)
					("texture", picnum)
					.EndObject();
				Add(viewpoint, picnum, fov);
			}
			arc.EndArray();
		}
	}
}